

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O3

bool Js::JavascriptLibrary::InitializeSharedArrayBufferPrototype
               (DynamicObject *sharedArrayBufferPrototype,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  ScriptContext *pSVar1;
  RuntimeFunction *pRVar2;
  RuntimeFunction *pRVar3;
  StaticType *type;
  LiteralString *pLVar4;
  
  DeferredTypeHandlerBase::Convert(typeHandler,sharedArrayBufferPrototype,mode,4,0);
  this = (((sharedArrayBufferPrototype->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  pSVar1 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  (*(sharedArrayBufferPrototype->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (sharedArrayBufferPrototype,0x67,(this->sharedArrayBufferConstructor).ptr,6,0,0,0);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)SharedArrayBuffer::EntryInfo::Slice,2,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0x150);
  (*(sharedArrayBufferPrototype->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (sharedArrayBufferPrototype,0x150,pRVar2,6,0,0,0);
  pRVar3 = CreateGetterFunction
                     (this,0x1a9,(FunctionInfo *)SharedArrayBuffer::EntryInfo::GetterByteLength);
  pRVar2 = (RuntimeFunction *)(this->super_JavascriptLibraryBase).undefinedValue.ptr;
  if (pRVar3 == (RuntimeFunction *)0x0) {
    pRVar3 = pRVar2;
  }
  (*(sharedArrayBufferPrototype->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x2d])
            (sharedArrayBufferPrototype,0x1a9,pRVar3,pRVar2,0);
  (*(sharedArrayBufferPrototype->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x3e])
            (sharedArrayBufferPrototype,0x1a9,6);
  if (((pSVar1->config).threadConfig)->m_ES6ToStringTag == true) {
    type = StringCache::GetStringTypeStatic(&this->stringCache);
    pLVar4 = LiteralString::New(type,L"SharedArrayBuffer",0x11,this->recycler);
    (*(sharedArrayBufferPrototype->super_RecyclableObject).super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
              (sharedArrayBufferPrototype,0x1b,pLVar4,2,0,0,0);
  }
  DynamicObject::SetHasNoEnumerableProperties(sharedArrayBufferPrototype,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeSharedArrayBufferPrototype(DynamicObject* sharedArrayBufferPrototype, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(sharedArrayBufferPrototype, mode, 4);

        ScriptContext* scriptContext = sharedArrayBufferPrototype->GetScriptContext();
        JavascriptLibrary* library = sharedArrayBufferPrototype->GetLibrary();
        library->AddMember(sharedArrayBufferPrototype, PropertyIds::constructor, library->sharedArrayBufferConstructor);
        library->AddFunctionToLibraryObject(sharedArrayBufferPrototype, PropertyIds::slice, &SharedArrayBuffer::EntryInfo::Slice, 2);
        library->AddAccessorsToLibraryObject(sharedArrayBufferPrototype, PropertyIds::byteLength, &SharedArrayBuffer::EntryInfo::GetterByteLength, nullptr);

        if (scriptContext->GetConfig()->IsES6ToStringTagEnabled())
        {
            library->AddMember(sharedArrayBufferPrototype, PropertyIds::_symbolToStringTag, library->CreateStringFromCppLiteral(_u("SharedArrayBuffer")), PropertyConfigurable);
        }

        sharedArrayBufferPrototype->SetHasNoEnumerableProperties(true);

        return true;
    }